

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O0

void __thiscall moira::Moira::reset<(moira::Core)0>(Moira *this)

{
  uint uVar1;
  u32 uVar2;
  int iVar3;
  undefined1 local_88 [120];
  Moira *local_10;
  Moira *this_local;
  
  this->flags = 0x40;
  local_10 = this;
  memset(local_88,0,0x78);
  memcpy(&this->reg,local_88,0x78);
  (this->reg).sr.s = true;
  (this->reg).sr.ipl = '\a';
  this->ipl = '\0';
  this->fcl = '\x02';
  this->fcSource = '\0';
  uVar1 = (*this->_vptr_Moira[5])(this,0);
  (this->reg).field_3.field_0.a[7] = uVar1 & 0xffff;
  uVar1 = (*this->_vptr_Moira[5])(this,2);
  uVar1 = uVar1 & 0xfffe | (this->reg).field_3.field_0.a[7] << 0x10;
  (this->reg).field_3.field_0.a[7] = uVar1;
  (this->reg).isp = uVar1;
  uVar1 = (*this->_vptr_Moira[5])(this,4);
  (this->reg).pc = uVar1 & 0xffff;
  uVar1 = (*this->_vptr_Moira[5])(this,6);
  (this->reg).pc = uVar1 & 0xfffe | (this->reg).pc << 0x10;
  uVar1 = (this->reg).pc;
  uVar2 = addrMask<(moira::Core)0>(this);
  iVar3 = (*this->_vptr_Moira[5])(this,(ulong)(uVar1 & uVar2));
  (this->queue).irc = (u16)iVar3;
  prefetch<(moira::Core)0,0ull>(this);
  Debugger::reset(&this->debugger);
  (*this->_vptr_Moira[10])();
  return;
}

Assistant:

void
Moira::reset()
{
    flags = State::CHECK_IRQ;

    reg = { };
    reg.sr.s = 1;
    reg.sr.ipl = 7;

    ipl = 0;
    fcl = 2;
    fcSource = 0;

    SYNC(16);

    // Read the initial (supervisor) stack pointer from memory
    SYNC(2);
    reg.sp = read16OnReset(0);
    SYNC(4);
    reg.isp = reg.sp = (read16OnReset(2) & ~0x1) | reg.sp << 16;
    SYNC(4);
    reg.pc = read16OnReset(4);
    SYNC(4);
    reg.pc = (read16OnReset(6) & ~0x1) | reg.pc << 16;

    // Fill the prefetch queue
    SYNC(4);
    queue.irc = read16OnReset(reg.pc & addrMask<C>());
    SYNC(2);
    prefetch<C>();

    // Reset subcomponents
    debugger.reset();

    // Inform the delegate
    cpuDidReset();
}